

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cpp
# Opt level: O2

VerySimpleReadOnlyString __thiscall
Strings::VerySimpleReadOnlyString::fromTo
          (VerySimpleReadOnlyString *this,VerySimpleReadOnlyString *from,
          VerySimpleReadOnlyString *to,bool includeFind)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int _length;
  undefined7 in_register_00000009;
  undefined8 extraout_RDX;
  char *_data;
  char in_R8B;
  uint pos;
  VerySimpleReadOnlyString VVar4;
  
  uVar2 = Find(from,to,0);
  pos = to->length + uVar2;
  uVar3 = Find(from,(VerySimpleReadOnlyString *)CONCAT71(in_register_00000009,includeFind),pos);
  uVar1 = from->length;
  if (uVar3 < uVar1) {
    if (in_R8B == '\0') {
      _length = uVar3 - pos;
    }
    else {
      _length = (uVar3 - uVar2) +
                ((VerySimpleReadOnlyString *)CONCAT71(in_register_00000009,includeFind))->length;
    }
  }
  else {
    _length = 0;
    if (in_R8B != '\0') {
      _length = uVar1 - uVar2;
    }
  }
  if (in_R8B != '\0') {
    pos = uVar2;
  }
  _data = "";
  if (uVar2 < uVar1) {
    _data = from->data + pos;
  }
  VerySimpleReadOnlyString(this,_data,_length);
  VVar4._8_8_ = extraout_RDX;
  VVar4.data = (tCharPtr)this;
  return VVar4;
}

Assistant:

const VerySimpleReadOnlyString VerySimpleReadOnlyString::fromTo(const VerySimpleReadOnlyString & from, const VerySimpleReadOnlyString & to, const bool includeFind) const
	{
	    const unsigned int fromPos = Find(from);
	    const unsigned int toPos = Find(to, fromPos + from.length);
	    return VerySimpleReadOnlyString(fromPos >= (unsigned int)length ? "" : &data[includeFind ? fromPos : fromPos + (unsigned int)from.length],
	                                    toPos < (unsigned int)length ? (includeFind ? toPos + (unsigned int)to.length - fromPos : toPos - fromPos - (unsigned int)from.length)
	                                       // If the "to" needle was not found, either we return the whole string (includeFind) or an empty string
	                                       : (includeFind ? (unsigned int)length - fromPos : 0));
	}